

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O2

void __thiscall
Debug::PosixCrashHandler::walkStackTrace
          (PosixCrashHandler *this,char *memory,size_t memorySize,int maxFrames)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  void *__ptr;
  char *__args;
  long lVar5;
  char *allocated;
  ulong uVar6;
  
  lVar5 = (long)maxFrames;
  memory[lVar5 * 8] = '\0';
  iVar3 = ::backtrace(memory,maxFrames);
  lVar1 = *(long *)(memory + 8);
  lVar2 = *(long *)(memory + 0x10);
  if (((this->m_backtraceFilePath)._M_string_length != 0) &&
     (__stream = fopen((this->m_backtraceFilePath)._M_dataplus._M_p,"a"), __stream != (FILE *)0x0))
  {
    fseek(__stream,0,2);
    iVar4 = fileno(__stream);
    backtrace_symbols_fd(memory,iVar3,iVar4);
    fclose(__stream);
  }
  __ptr = (void *)backtrace_symbols(memory);
  if (__ptr != (void *)0x0) {
    uVar6 = (ulong)(lVar2 == lVar1);
    while (uVar6 = uVar6 + 1, (long)uVar6 < (long)iVar3) {
      memset(memory + lVar5 * 8 + 1,0,~(lVar5 << 3) + memorySize);
      __args = dlDemangle(this,*(void **)(memory + uVar6 * 8),*(char **)((long)__ptr + uVar6 * 8),
                          (int)uVar6,memory + lVar5 * 8 + 1);
      if (__args != (char *)0x0) {
        std::function<void_(const_char_*)>::operator()(&this->m_backtraceCallback,__args);
      }
    }
    if (iVar3 == maxFrames) {
      std::function<void_(const_char_*)>::operator()(&this->m_backtraceCallback,"[truncated]\n");
    }
  }
  free(__ptr);
  return;
}

Assistant:

void PosixCrashHandler::walkStackTrace(char *memory, size_t memorySize, int maxFrames) {
        const size_t framesSize = maxFrames * sizeof(void*);
        void **callstack = reinterpret_cast<void**>(fake_alloc(&memory, framesSize));
        int frames = ::backtrace(callstack, maxFrames);

        const int stackOffset = callstack[2] == callstack[1] ? 2 : 1;

        if (!m_backtraceFilePath.empty()) {
            if (FILE *fp = fopen(m_backtraceFilePath.c_str(), "a")) {
                fseek(fp, 0, SEEK_END);
                int fd = fileno(fp);
                backtrace_symbols_fd(callstack, frames, fd);
                fclose(fp);
            }
        }

        std::unique_ptr<char*, FreeDeleter> symbolsPtr(backtrace_symbols(callstack, frames));
        if (!symbolsPtr) { return; }

        char **symbols = symbolsPtr.get();

        for (int i = stackOffset; i < frames; ++i) {
            memset(memory, 0, memorySize - framesSize - 1);

            char *stackFrame = dlDemangle(callstack[i], symbols[i], i, memory);
            if (stackFrame) {
                m_backtraceCallback(stackFrame);
            }
        }

        if (frames == maxFrames) {
            m_backtraceCallback("[truncated]\n");
        }
    }